

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FullyConnectedLayer::calcInducedLocalField(FullyConnectedLayer *this,Array *inputs)

{
  element_type *peVar1;
  float *m_begin;
  float *m_end;
  float *x_begin;
  float *x_end;
  float *b_begin;
  float *b_end;
  Array *inputs_local;
  FullyConnectedLayer *this_local;
  
  peVar1 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->bias);
  std::valarray<float>::operator=(&this->inducedLocalField,peVar1);
  peVar1 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->weights);
  m_begin = std::begin<float>(peVar1);
  peVar1 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->weights);
  m_end = std::end<float>(peVar1);
  x_begin = std::begin<float>(inputs);
  x_end = std::end<float>(inputs);
  b_begin = std::begin<float>(&this->inducedLocalField);
  b_end = std::end<float>(&this->inducedLocalField);
  internal::gemv<float*,float_const*,float*>(m_begin,m_end,x_begin,x_end,b_begin,b_end);
  return;
}

Assistant:

void calcInducedLocalField(const Array &inputs) {
        inducedLocalField = *bias; // will be added and overwritten
        internal::gemv(
             std::begin(*weights), std::end(*weights), std::begin(inputs),
             std::end(inputs), std::begin(inducedLocalField),
             std::end(inducedLocalField));
    }